

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::Dispatcher::AddTimer
          (Dispatcher *this,shared_ptr<cppnet::RWSocket> *sock,uint32_t interval,bool always)

{
  uint16_t *puVar1;
  element_type *peVar2;
  uint32_t uVar3;
  pthread_t pVar4;
  __shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __0 *this_01;
  long *in_FS_OFFSET;
  shared_ptr<cppnet::TimerEvent> event;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_70;
  anon_class_40_5_2d89cefe task;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::make_shared<cppnet::TimerEvent>();
  puVar1 = &((event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Event)._event_type;
  *puVar1 = *puVar1 | 8;
  std::__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<cppnet::RWSocket,void>
            ((__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             &sock->super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)
             &((event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Event)._socket,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  uVar3 = MakeTimerID(this);
  pVar4 = pthread_self();
  if (pVar4 == (this->_local_thread_id)._M_thread) {
    peVar2 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<cppnet::TimerEvent,void>
              (local_78,&event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>);
    (**peVar2->_vptr_Timer)(peVar2,local_78,(ulong)interval,(ulong)always);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_70);
    __all_timer_event_map::__tls_init();
    task.event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(ulong)uVar3;
    this_00 = &std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(*in_FS_OFFSET + -0xc0),(key_type *)&task)->
               super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>);
    (*((this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_EventActions[0xb])();
  }
  else {
    std::__shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2> *)&task,
               &event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>);
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    task.timer_id = uVar3;
    task.interval = interval;
    task.always = always;
    task.this = this;
    this_01 = (__0 *)operator_new(0x28);
    AddTimer(std::shared_ptr<cppnet::RWSocket>,unsigned_int,bool)::$_0::__0(this_01,&task);
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:166:21)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:166:21)>
               ::_M_manager;
    local_98._M_unused._0_8_ = (undefined8)this_01;
    PostTask(this,(Task *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task.event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return uVar3;
}

Assistant:

uint32_t Dispatcher::AddTimer(std::shared_ptr<RWSocket> sock, uint32_t interval, bool always) {
    std::shared_ptr<TimerEvent> event = std::make_shared<TimerEvent>();
    event->AddType(ET_TIMER);
    event->SetSocket(sock);

    uint32_t timer_id = MakeTimerID();

    if (std::this_thread::get_id() == _local_thread_id) {
        _timer->AddTimer(event, interval, always);
        __all_timer_event_map[timer_id] = event;
        _event_actions->Wakeup();
        
    } else {
        auto task = [event, timer_id, interval, always, this]() {
            _timer->AddTimer(event, interval, always);
            __all_timer_event_map[timer_id] = event;
        };
        PostTask(task);
    }
    return timer_id;
}